

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O3

void apriltag_detector_destroy(apriltag_detector_t *td)

{
  timeprofile_t *__ptr;
  zarray_t *pzVar1;
  
  __ptr = td->tp;
  pzVar1 = __ptr->stamps;
  if (pzVar1 != (zarray_t *)0x0) {
    if (pzVar1->data != (char *)0x0) {
      free(pzVar1->data);
    }
    free(pzVar1);
  }
  free(__ptr);
  workerpool_destroy(td->wp);
  apriltag_detector_clear_families(td);
  pzVar1 = td->tag_families;
  if (pzVar1 != (zarray_t *)0x0) {
    if (pzVar1->data != (char *)0x0) {
      free(pzVar1->data);
    }
    free(pzVar1);
  }
  free(td);
  return;
}

Assistant:

void apriltag_detector_destroy(apriltag_detector_t *td)
{
    timeprofile_destroy(td->tp);
    workerpool_destroy(td->wp);

    apriltag_detector_clear_families(td);

    zarray_destroy(td->tag_families);
    free(td);
}